

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O0

VectorXi __thiscall ear::ngonVertexOrder(ear *this,MatrixXd *vertices)

{
  long lVar1;
  Index IVar2;
  Index extraout_RDX;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *this_00;
  double extraout_XMM0_Qa;
  VectorXi VVar3;
  Matrix<double,__1,_1,_0,__1,_1> local_360;
  anon_class_1_0_00000001_for_op local_349;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_348;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_318;
  undefined1 local_2e8 [8];
  CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  vertexAngles;
  ExpressionTypeNested local_270;
  undefined1 local_268 [8];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>
  verticesRelCentre;
  double angle;
  TransposeReturnType local_200;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_1c8;
  undefined1 local_180 [8];
  Vector3d vertex;
  double dStack_160;
  int i;
  double min;
  TransposeReturnType local_120;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_e8;
  undefined1 local_a0 [8];
  Vector3d b;
  Vector3d a;
  MeanReturnType local_68;
  Matrix<double,3,1,0,3,1> local_30 [8];
  Vector3d centre;
  MatrixXd *vertices_local;
  
  centre.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)vertices;
  a.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colwise
                         ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)vertices);
  Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::mean
            (&local_68,
             (VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const>>
            (local_30,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
                       *)&local_68);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (b.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_a0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            ((RowXpr *)&min,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)vertices,0);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::transpose
            (&local_120,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             &min);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>>
  ::operator-(&local_e8,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>>
               *)&local_120,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (b.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)&local_e8);
  dStack_160 = std::numeric_limits<double>::max();
  vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
  _4_4_ = 1;
  while( true ) {
    lVar1 = (long)vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2]._4_4_;
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&vertices->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if (IVar2 <= lVar1) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              ((RowXpr *)&angle,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)vertices,
               (long)vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[2]._4_4_);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    transpose(&local_200,
              (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
              &angle);
    Eigen::
    MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>>::
    operator-(&local_1c8,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>>
               *)&local_200,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,3,1,0,3,1> *)local_180,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_1c8);
    this_00 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_180;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
              (this_00,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       (b.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2));
    std::abs((int)this_00);
    if (extraout_XMM0_Qa < dStack_160) {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)local_a0,
                 (Matrix<double,_3,_1,_0,_3,_1> *)local_180);
      dStack_160 = extraout_XMM0_Qa;
    }
    vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
    _4_4_ = vertex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2]._4_4_ + 1;
  }
  local_270 = (ExpressionTypeNested)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)vertices);
  vertexAngles._104_8_ =
       Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                 ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>
              *)local_268,(VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_270,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
             &vertexAngles.field_0x68);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,-1,1>const>>
  ::operator*(&local_318,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>>
               *)local_268,
              (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
              (b.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              + 2));
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,-1,1>const>>
  ::operator*(&local_348,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>>
               *)local_268,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a0);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,-1,1>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::
  binaryExpr<ear::ngonVertexOrder(Eigen::Matrix<double,_1,_1,0,_1,_1>)::__0,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)local_2e8,&local_318,
             (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_348,&local_349);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<ear::ngonVertexOrder(Eigen::Matrix<double,_1,_1,0,_1,_1>)::__0,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_360,
             (EigenBase<Eigen::CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)local_2e8);
  argSort(this,(VectorXd *)&local_360);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_360);
  VVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = extraout_RDX;
  VVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this;
  return (VectorXi)VVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXi ngonVertexOrder(Eigen::MatrixXd vertices) {
    Eigen::Vector3d centre = vertices.colwise().mean();

    // Pick two vertices to form a plane (with the third point being the
    // origin); the vertices are ordered by the angles of points projected onto
    // this plane. The first is picked arbitrarily, the second is picked to
    // minimise the colinearity with the first.
    Eigen::Vector3d a;
    Eigen::Vector3d b;
    a = vertices.row(0).transpose() - centre;
    double min = std::numeric_limits<double>::max();
    for (int i = 1; i < vertices.rows(); ++i) {
      Eigen::Vector3d vertex = vertices.row(i).transpose() - centre;
      double angle = std::abs(vertex.dot(a));
      if (angle < min) {
        min = angle;
        b = vertex;
      }
    }
    // These vectors are neither normalised or orthogonal, so the projection
    // onto them produces a linear transformation from the projection onto the
    // plane (relative to the origin); this is fine, as affine transformations
    // preserve straight lines.

    // find the angle of the projection of each vertex onto the plane
    auto verticesRelCentre = vertices.rowwise() - centre.transpose();
    auto vertexAngles =
        (verticesRelCentre * a)
            .binaryExpr(verticesRelCentre * b,
                        [](double a, double b) { return std::atan2(a, b); });
    return argSort(vertexAngles);
  }